

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

int X509_policy_check(X509_POLICY_TREE **ptree,int *pexplicit_policy,stack_st_X509 *certs,
                     stack_st_ASN1_OBJECT *policy_oids,uint flags)

{
  stack_st_X509_POLICY_LEVEL *level_00;
  int iVar1;
  X509 *x;
  size_t sVar2;
  bool bVar3;
  bool local_aa;
  bool local_a9;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  X509_POLICY_LEVEL *current_level;
  int any_policy_allowed;
  int is_self_issued;
  X509 *cert;
  size_t i;
  size_t policy_mapping;
  size_t inhibit_any_policy;
  size_t explicit_policy;
  size_t num_certs;
  stack_st_ASN1_OBJECT *user_policies_sorted;
  stack_st_X509_POLICY_LEVEL *levels;
  X509_POLICY_LEVEL *level;
  stack_st_ASN1_OBJECT *psStack_30;
  int ret;
  X509 **out_current_cert_local;
  unsigned_long flags_local;
  stack_st_ASN1_OBJECT *user_policies_local;
  stack_st_X509 *certs_local;
  
  *(undefined8 *)&policy_oids->stack = 0;
  level._4_4_ = 0x11;
  levels = (stack_st_X509_POLICY_LEVEL *)0x0;
  user_policies_sorted = (stack_st_ASN1_OBJECT *)0x0;
  num_certs = 0;
  psStack_30 = policy_oids;
  out_current_cert_local = (X509 **)certs;
  flags_local = (unsigned_long)pexplicit_policy;
  user_policies_local = (stack_st_ASN1_OBJECT *)ptree;
  explicit_policy = sk_X509_num((stack_st_X509 *)ptree);
  if (explicit_policy < 2) {
    return 0;
  }
  if (((ulong)out_current_cert_local & 0x100) == 0) {
    local_98 = explicit_policy + 1;
  }
  else {
    local_98 = 0;
  }
  inhibit_any_policy = local_98;
  if (((ulong)out_current_cert_local & 0x200) == 0) {
    local_a0 = explicit_policy + 1;
  }
  else {
    local_a0 = 0;
  }
  policy_mapping = local_a0;
  if (((ulong)out_current_cert_local & 0x400) == 0) {
    local_a8 = explicit_policy + 1;
  }
  else {
    local_a8 = 0;
  }
  i = local_a8;
  user_policies_sorted = (stack_st_ASN1_OBJECT *)sk_X509_POLICY_LEVEL_new_null();
  if (user_policies_sorted != (stack_st_ASN1_OBJECT *)0x0) {
    for (cert = (X509 *)(explicit_policy - 2); cert < explicit_policy;
        cert = (X509 *)((long)&cert[-1].lock + 0x37)) {
      x = sk_X509_value((stack_st_X509 *)user_policies_local,(size_t)cert);
      iVar1 = x509v3_cache_extensions(x);
      if (iVar1 == 0) goto LAB_00311987;
      bVar3 = (x->ex_flags & 0x20) != 0;
      if (levels == (stack_st_X509_POLICY_LEVEL *)0x0) {
        if (cert != (X509 *)(explicit_policy - 2)) {
          __assert_fail("i == num_certs - 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                        ,0x2be,
                        "int X509_policy_check(const struct stack_st_X509 *, const struct stack_st_ASN1_OBJECT *, unsigned long, X509 **)"
                       );
        }
        levels = (stack_st_X509_POLICY_LEVEL *)x509_policy_level_new();
        if ((X509_POLICY_LEVEL *)levels == (X509_POLICY_LEVEL *)0x0) goto LAB_00311987;
        ((X509_POLICY_LEVEL *)levels)->has_any_policy = 1;
      }
      local_a9 = true;
      if (policy_mapping == 0) {
        local_aa = cert != (X509 *)0x0 && bVar3;
        local_a9 = local_aa;
      }
      iVar1 = process_certificate_policies(x,(X509_POLICY_LEVEL *)levels,(uint)local_a9);
      if (iVar1 == 0) {
        level._4_4_ = 0x2a;
        *(X509 **)&psStack_30->stack = x;
        goto LAB_00311987;
      }
      if ((inhibit_any_policy == 0) &&
         (iVar1 = x509_policy_level_is_empty((X509_POLICY_LEVEL *)levels), iVar1 != 0)) {
        level._4_4_ = 0x2b;
        goto LAB_00311987;
      }
      sVar2 = sk_X509_POLICY_LEVEL_push
                        ((stack_st_X509_POLICY_LEVEL *)user_policies_sorted,
                         (X509_POLICY_LEVEL *)levels);
      level_00 = levels;
      if (sVar2 == 0) goto LAB_00311987;
      levels = (stack_st_X509_POLICY_LEVEL *)0x0;
      if ((cert != (X509 *)0x0) &&
         (levels = (stack_st_X509_POLICY_LEVEL *)
                   process_policy_mappings(x,(X509_POLICY_LEVEL *)level_00,(uint)(i != 0)),
         (X509_POLICY_LEVEL *)levels == (X509_POLICY_LEVEL *)0x0)) {
        level._4_4_ = 0x2a;
        *(X509 **)&psStack_30->stack = x;
        goto LAB_00311987;
      }
      if ((cert == (X509 *)0x0) || (!bVar3)) {
        if (inhibit_any_policy != 0) {
          inhibit_any_policy = inhibit_any_policy - 1;
        }
        if (i != 0) {
          i = i - 1;
        }
        if (policy_mapping != 0) {
          policy_mapping = policy_mapping - 1;
        }
      }
      iVar1 = process_policy_constraints(x,&inhibit_any_policy,&i,&policy_mapping);
      if (iVar1 == 0) {
        level._4_4_ = 0x2a;
        *(X509 **)&psStack_30->stack = x;
        goto LAB_00311987;
      }
    }
    if (inhibit_any_policy == 0) {
      if (flags_local != 0) {
        num_certs = (size_t)sk_ASN1_OBJECT_dup((stack_st_ASN1_OBJECT *)flags_local);
        if ((stack_st_ASN1_OBJECT *)num_certs == (stack_st_ASN1_OBJECT *)0x0) goto LAB_00311987;
        sk_ASN1_OBJECT_set_cmp_func((stack_st_ASN1_OBJECT *)num_certs,asn1_object_cmp);
        sk_ASN1_OBJECT_sort((stack_st_ASN1_OBJECT *)num_certs);
      }
      iVar1 = has_explicit_policy((stack_st_X509_POLICY_LEVEL *)user_policies_sorted,
                                  (stack_st_ASN1_OBJECT *)num_certs);
      if (iVar1 == 0) {
        level._4_4_ = 0x2b;
        goto LAB_00311987;
      }
    }
    level._4_4_ = 0;
  }
LAB_00311987:
  x509_policy_level_free((X509_POLICY_LEVEL *)levels);
  sk_ASN1_OBJECT_free((stack_st_ASN1_OBJECT *)num_certs);
  sk_X509_POLICY_LEVEL_pop_free
            ((stack_st_X509_POLICY_LEVEL *)user_policies_sorted,x509_policy_level_free);
  return level._4_4_;
}

Assistant:

int X509_policy_check(const STACK_OF(X509) *certs,
                      const STACK_OF(ASN1_OBJECT) *user_policies,
                      unsigned long flags, X509 **out_current_cert) {
  *out_current_cert = NULL;
  int ret = X509_V_ERR_OUT_OF_MEM;
  X509_POLICY_LEVEL *level = NULL;
  STACK_OF(X509_POLICY_LEVEL) *levels = NULL;
  STACK_OF(ASN1_OBJECT) *user_policies_sorted = NULL;
  size_t num_certs = sk_X509_num(certs);

  // Skip policy checking if the chain is just the trust anchor.
  if (num_certs <= 1) {
    return X509_V_OK;
  }

  // See RFC 5280, section 6.1.2, steps (d) through (f).
  size_t explicit_policy =
      (flags & X509_V_FLAG_EXPLICIT_POLICY) ? 0 : num_certs + 1;
  size_t inhibit_any_policy =
      (flags & X509_V_FLAG_INHIBIT_ANY) ? 0 : num_certs + 1;
  size_t policy_mapping = (flags & X509_V_FLAG_INHIBIT_MAP) ? 0 : num_certs + 1;

  levels = sk_X509_POLICY_LEVEL_new_null();
  if (levels == NULL) {
    goto err;
  }

  for (size_t i = num_certs - 2; i < num_certs; i--) {
    X509 *cert = sk_X509_value(certs, i);
    if (!x509v3_cache_extensions(cert)) {
      goto err;
    }
    const int is_self_issued = (cert->ex_flags & EXFLAG_SI) != 0;

    if (level == NULL) {
      assert(i == num_certs - 2);
      level = x509_policy_level_new();
      if (level == NULL) {
        goto err;
      }
      level->has_any_policy = 1;
    }

    // RFC 5280, section 6.1.3, steps (d) and (e). |any_policy_allowed| is
    // computed as in step (d.2).
    const int any_policy_allowed =
        inhibit_any_policy > 0 || (i > 0 && is_self_issued);
    if (!process_certificate_policies(cert, level, any_policy_allowed)) {
      ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
      *out_current_cert = cert;
      goto err;
    }

    // RFC 5280, section 6.1.3, step (f).
    if (explicit_policy == 0 && x509_policy_level_is_empty(level)) {
      ret = X509_V_ERR_NO_EXPLICIT_POLICY;
      goto err;
    }

    // Insert into the list.
    if (!sk_X509_POLICY_LEVEL_push(levels, level)) {
      goto err;
    }
    X509_POLICY_LEVEL *current_level = level;
    level = NULL;

    // If this is not the leaf certificate, we go to section 6.1.4. If it
    // is the leaf certificate, we go to section 6.1.5 instead.
    if (i != 0) {
      // RFC 5280, section 6.1.4, steps (a) and (b).
      level = process_policy_mappings(cert, current_level, policy_mapping > 0);
      if (level == NULL) {
        ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
        *out_current_cert = cert;
        goto err;
      }
    }

    // RFC 5280, section 6.1.4, step (h-j) for non-leaves, and section 6.1.5,
    // step (a-b) for leaves. In the leaf case, RFC 5280 says only to update
    // |explicit_policy|, but |policy_mapping| and |inhibit_any_policy| are no
    // longer read at this point, so we use the same process.
    if (i == 0 || !is_self_issued) {
      if (explicit_policy > 0) {
        explicit_policy--;
      }
      if (policy_mapping > 0) {
        policy_mapping--;
      }
      if (inhibit_any_policy > 0) {
        inhibit_any_policy--;
      }
    }
    if (!process_policy_constraints(cert, &explicit_policy, &policy_mapping,
                                    &inhibit_any_policy)) {
      ret = X509_V_ERR_INVALID_POLICY_EXTENSION;
      *out_current_cert = cert;
      goto err;
    }
  }

  // RFC 5280, section 6.1.5, step (g). We do not output the policy set, so it
  // is only necessary to check if the user-constrained-policy-set is not empty.
  if (explicit_policy == 0) {
    // Build a sorted copy of |user_policies| for more efficient lookup.
    if (user_policies != NULL) {
      user_policies_sorted = sk_ASN1_OBJECT_dup(user_policies);
      if (user_policies_sorted == NULL) {
        goto err;
      }
      sk_ASN1_OBJECT_set_cmp_func(user_policies_sorted, asn1_object_cmp);
      sk_ASN1_OBJECT_sort(user_policies_sorted);
    }

    if (!has_explicit_policy(levels, user_policies_sorted)) {
      ret = X509_V_ERR_NO_EXPLICIT_POLICY;
      goto err;
    }
  }

  ret = X509_V_OK;

err:
  x509_policy_level_free(level);
  // |user_policies_sorted|'s contents are owned by |user_policies|, so we do
  // not use |sk_ASN1_OBJECT_pop_free|.
  sk_ASN1_OBJECT_free(user_policies_sorted);
  sk_X509_POLICY_LEVEL_pop_free(levels, x509_policy_level_free);
  return ret;
}